

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexerHelper.cxx
# Opt level: O3

void __thiscall
cmCTestResourceGroupsLexerHelper::WriteRequirement(cmCTestResourceGroupsLexerHelper *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCTestTestResourceRequirement local_48;
  
  paVar1 = &local_48.ResourceType.field_2;
  pcVar2 = (this->ResourceType)._M_dataplus._M_p;
  local_48.ResourceType._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (this->ResourceType)._M_string_length);
  local_48.SlotsNeeded = this->NeededSlots;
  local_48.UnitsNeeded = 1;
  std::
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  ::emplace_back<cmCTestTestHandler::cmCTestTestResourceRequirement>(&this->Process,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.ResourceType._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.ResourceType._M_dataplus._M_p,
                    local_48.ResourceType.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestResourceGroupsLexerHelper::WriteRequirement()
{
  this->Process.push_back({ this->ResourceType, this->NeededSlots, 1 });
}